

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_tec_histogram_frame(REF_GRID ref_grid,char *zone_title)

{
  uint uVar1;
  FILE *pFVar2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_HISTOGRAM ref_histogram;
  REF_GATHER ref_gather;
  char *zone_title_local;
  REF_GRID ref_grid_local;
  
  ref_histogram = (REF_HISTOGRAM)ref_grid->gather;
  ref_gather = (REF_GATHER)zone_title;
  zone_title_local = (char *)ref_grid;
  if ((ref_grid->mpi->id == 0) && ((FILE *)ref_histogram->log_total == (FILE *)0x0)) {
    pFVar2 = fopen("ref_gather_histo.tec","w");
    ref_histogram->log_total = (REF_DBL)pFVar2;
    if (ref_histogram->log_total == 0.0) {
      printf("unable to open ref_gather_histo.tec\n");
    }
    if (ref_histogram->log_total == 0.0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x348,"ref_gather_tec_histogram_frame","unable to open file");
      return 2;
    }
    fprintf((FILE *)ref_histogram->log_total,"title=\"tecplot refine histogram\"\n");
    fprintf((FILE *)ref_histogram->log_total,"variables = \"Edge Length\" \"Normalized Count\"\n");
  }
  uVar1 = ref_histogram_create((REF_HISTOGRAM *)&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_resolution(_ref_private_macro_code_rss_1,0x120,12.0);
    if (uVar1 == 0) {
      uVar1 = ref_histogram_add_ratio(_ref_private_macro_code_rss_1,(REF_GRID)zone_title_local);
      if (uVar1 == 0) {
        if ((*(int *)(*(long *)zone_title_local + 4) == 0) &&
           (uVar1 = ref_histogram_zone(_ref_private_macro_code_rss_1,
                                       (FILE *)ref_histogram->log_total,(char *)ref_gather,
                                       ref_histogram->log_mean), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x358,"ref_gather_tec_histogram_frame",(ulong)uVar1,"tec zone");
          ref_grid_local._4_4_ = uVar1;
        }
        else {
          ref_grid_local._4_4_ = ref_histogram_free(_ref_private_macro_code_rss_1);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x35b,"ref_gather_tec_histogram_frame",(ulong)ref_grid_local._4_4_,"free gram");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x353,"ref_gather_tec_histogram_frame",(ulong)uVar1,"add ratio");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x351,"ref_gather_tec_histogram_frame",(ulong)uVar1,"res");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x350,
           "ref_gather_tec_histogram_frame",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_tec_histogram_frame(
    REF_GRID ref_grid, const char *zone_title) {
  REF_GATHER ref_gather = ref_grid_gather(ref_grid);
  REF_HISTOGRAM ref_histogram;

  if (ref_grid_once(ref_grid)) {
    if (NULL == (void *)(ref_gather->hist_file)) {
      ref_gather->hist_file = fopen("ref_gather_histo.tec", "w");
      if (NULL == (void *)(ref_gather->hist_file))
        printf("unable to open ref_gather_histo.tec\n");
      RNS(ref_gather->hist_file, "unable to open file");

      fprintf(ref_gather->hist_file, "title=\"tecplot refine histogram\"\n");
      fprintf(ref_gather->hist_file,
              "variables = \"Edge Length\" \"Normalized Count\"\n");
    }
  }

  RSS(ref_histogram_create(&ref_histogram), "create");
  RSS(ref_histogram_resolution(ref_histogram, 288, 12.0), "res");

  RSS(ref_histogram_add_ratio(ref_histogram, ref_grid), "add ratio");

  if (ref_grid_once(ref_grid)) {
    RSS(ref_histogram_zone(ref_histogram, ref_gather->hist_file, zone_title,
                           ref_gather->time),
        "tec zone");
  }

  RSS(ref_histogram_free(ref_histogram), "free gram");

  return REF_SUCCESS;
}